

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndRgEa<(moira::Instr)59,(moira::Mode)7,(moira::Size)4>(Moira *this,u16 opcode)

{
  uint uVar1;
  u32 addr;
  u32 uVar2;
  undefined8 in_RAX;
  uint uVar3;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  addr = computeEA<(moira::Mode)7,(moira::Size)4,0ul>(this,opcode & 7);
  uVar2 = readM<(moira::MemSpace)1,(moira::Size)4,0ul>(this,addr,&local_21);
  if (local_21 == false) {
    uVar1 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
    uVar3 = uVar1 ^ uVar2;
    (this->reg).sr.n = SUB41(uVar3 >> 0x1f,0);
    (this->reg).sr.z = uVar1 == uVar2;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,addr + 2,uVar3 & 0xffff);
    writeM<(moira::MemSpace)1,(moira::Size)2,5ul>(this,addr,uVar3 >> 0x10);
  }
  return;
}

Assistant:

void
Moira::execAndRgEa(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    u32 ea, data;
    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;

    u32 result = logic<I,S>(readD<S>(src), data);
    isMemMode(M) ? prefetch() : prefetch<POLLIPL>();

    if (S == Long && isRegMode(M)) sync(4);
    writeOp <M,S, POLLIPL | REVERSE> (dst, ea, result);
}